

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O2

TWords * __thiscall
NJamSpell::TSpellCorrector::Edits2
          (TWords *__return_storage_ptr__,TSpellCorrector *this,TWord *word,bool lastLevel)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pbVar1;
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  *puVar2;
  pointer pwVar3;
  __node_base *p_Var4;
  pointer pwVar5;
  size_type *local_f8;
  wstring w;
  undefined1 auStack_b8 [8];
  wstring s;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_90;
  undefined1 local_70 [8];
  TWord c;
  
  local_f8 = &w._M_string_length;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_f8,word->Ptr,word->Ptr + word->Len);
  (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pwVar5 = (pointer)0x0;
  while (pwVar5 < w._M_dataplus._M_p + 1U) {
    if (pwVar5 < w._M_dataplus._M_p) {
      std::__cxx11::wstring::substr((ulong)&local_90,(ulong)&local_f8);
      std::__cxx11::wstring::substr((ulong)local_70,(ulong)&local_f8);
      std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     auStack_b8,&local_90,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     local_70);
      std::__cxx11::wstring::~wstring((wstring *)local_70);
      std::__cxx11::wstring::~wstring((wstring *)&local_90);
      _local_70 = TLangModel::GetWord(&this->LangModel,
                                      (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                       *)auStack_b8);
      if (local_70._8_8_ != 0 && local_70 != (wchar_t *)0x0) {
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_70);
      }
      if (!lastLevel) {
        w.field_2._8_8_ = auStack_b8;
        Edits2((TWords *)&local_90,this,(TWord *)((long)&w.field_2 + 8),true);
        AddVec<std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>
                  (__return_storage_ptr__,
                   (vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&local_90);
        std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
                  ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&local_90);
      }
      std::__cxx11::wstring::~wstring((wstring *)auStack_b8);
    }
    pwVar3 = (pointer)((long)pwVar5 + 1);
    if (pwVar3 < w._M_dataplus._M_p) {
      std::__cxx11::wstring::substr((ulong)auStack_b8,(ulong)&local_f8);
      std::__cxx11::wstring::substr((ulong)&local_90,(ulong)&local_f8);
      std::__cxx11::wstring::append((wstring *)auStack_b8);
      std::__cxx11::wstring::~wstring((wstring *)&local_90);
      std::__cxx11::wstring::substr((ulong)&local_90,(ulong)&local_f8);
      std::__cxx11::wstring::append((wstring *)auStack_b8);
      std::__cxx11::wstring::~wstring((wstring *)&local_90);
      if ((pointer)((long)pwVar5 + 2U) < w._M_dataplus._M_p) {
        std::__cxx11::wstring::substr((ulong)&local_90,(ulong)&local_f8);
        std::__cxx11::wstring::append((wstring *)auStack_b8);
        std::__cxx11::wstring::~wstring((wstring *)&local_90);
      }
      _local_70 = TLangModel::GetWord(&this->LangModel,
                                      (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                       *)auStack_b8);
      if (local_70._8_8_ != 0 && local_70 != (wchar_t *)0x0) {
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_70);
      }
      if (!lastLevel) {
        w.field_2._8_8_ = auStack_b8;
        Edits2((TWords *)&local_90,this,(TWord *)((long)&w.field_2 + 8),true);
        AddVec<std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>
                  (__return_storage_ptr__,
                   (vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&local_90);
        std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
                  ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&local_90);
      }
      std::__cxx11::wstring::~wstring((wstring *)auStack_b8);
    }
    s.field_2._8_8_ = pwVar5;
    if (pwVar5 < w._M_dataplus._M_p) {
      puVar2 = TLangModel::GetAlphabet(&this->LangModel);
      p_Var4 = &(puVar2->_M_h)._M_before_begin;
      while( true ) {
        p_Var4 = p_Var4->_M_nxt;
        if (p_Var4 == (__node_base *)0x0) break;
        std::__cxx11::wstring::substr((ulong)local_70,(ulong)&local_f8);
        std::operator+(&local_90,
                       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )local_70,(wchar_t)*(size_type *)(p_Var4 + 1));
        pbVar1 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 (&w.field_2._M_allocated_capacity + 1);
        std::__cxx11::wstring::substr((ulong)pbVar1,(ulong)&local_f8);
        std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )auStack_b8,&local_90,pbVar1);
        std::__cxx11::wstring::~wstring((wstring *)pbVar1);
        std::__cxx11::wstring::~wstring((wstring *)&local_90);
        std::__cxx11::wstring::~wstring((wstring *)local_70);
        _local_70 = TLangModel::GetWord(&this->LangModel,
                                        (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                         *)auStack_b8);
        if (local_70._8_8_ != 0 && local_70 != (wchar_t *)0x0) {
          std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                    (__return_storage_ptr__,(value_type *)local_70);
        }
        if (!lastLevel) {
          w.field_2._8_8_ = auStack_b8;
          Edits2((TWords *)&local_90,this,(TWord *)((long)&w.field_2 + 8),true);
          AddVec<std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>
                    (__return_storage_ptr__,
                     (vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&local_90);
          std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
                    ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&local_90)
          ;
        }
        std::__cxx11::wstring::~wstring((wstring *)auStack_b8);
      }
    }
    puVar2 = TLangModel::GetAlphabet(&this->LangModel);
    p_Var4 = &(puVar2->_M_h)._M_before_begin;
    while( true ) {
      p_Var4 = p_Var4->_M_nxt;
      pwVar5 = pwVar3;
      if (p_Var4 == (__node_base *)0x0) break;
      std::__cxx11::wstring::substr((ulong)local_70,(ulong)&local_f8);
      std::operator+(&local_90,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     local_70,(wchar_t)*(size_type *)(p_Var4 + 1));
      pbVar1 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               (&w.field_2._M_allocated_capacity + 1);
      std::__cxx11::wstring::substr((ulong)pbVar1,(ulong)&local_f8);
      std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     auStack_b8,&local_90,pbVar1);
      std::__cxx11::wstring::~wstring((wstring *)pbVar1);
      std::__cxx11::wstring::~wstring((wstring *)&local_90);
      std::__cxx11::wstring::~wstring((wstring *)local_70);
      _local_70 = TLangModel::GetWord(&this->LangModel,
                                      (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                       *)auStack_b8);
      if (local_70._8_8_ != 0 && local_70 != (wchar_t *)0x0) {
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_70);
      }
      if (!lastLevel) {
        w.field_2._8_8_ = auStack_b8;
        Edits2((TWords *)&local_90,this,(TWord *)((long)&w.field_2 + 8),true);
        AddVec<std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>
                  (__return_storage_ptr__,
                   (vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&local_90);
        std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
                  ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&local_90);
      }
      std::__cxx11::wstring::~wstring((wstring *)auStack_b8);
    }
  }
  std::__cxx11::wstring::~wstring((wstring *)&local_f8);
  return __return_storage_ptr__;
}

Assistant:

TWords TSpellCorrector::Edits2(const TWord& word, bool lastLevel) const {
    std::wstring w(word.Ptr, word.Len);
    TWords result;

    for (size_t i = 0; i < w.size() + 1; ++i) {
        // delete
        if (i < w.size()) {
            std::wstring s = w.substr(0, i) + w.substr(i+1);
            TWord c = LangModel.GetWord(s);
            if (c.Ptr && c.Len) {
                result.push_back(c);
            }
            if (!lastLevel) {
                AddVec(result, Edits2(TWord(s)));
            }
        }

        // transpose
        if (i + 1 < w.size()) {
            std::wstring s = w.substr(0, i);
            s += w.substr(i + 1, 1);
            s += w.substr(i, 1);
            if (i + 2 < w.size()) {
                s += w.substr(i+2);
            }
            TWord c = LangModel.GetWord(s);
            if (c.Ptr && c.Len) {
                result.push_back(c);
            }
            if (!lastLevel) {
                AddVec(result, Edits2(TWord(s)));
            }
        }

        // replace
        if (i < w.size()) {
            for (auto&& ch: LangModel.GetAlphabet()) {
                std::wstring s = w.substr(0, i) + ch + w.substr(i+1);
                TWord c = LangModel.GetWord(s);
                if (c.Ptr && c.Len) {
                    result.push_back(c);
                }
                if (!lastLevel) {
                    AddVec(result, Edits2(TWord(s)));
                }
            }
        }

        // inserts
        {
            for (auto&& ch: LangModel.GetAlphabet()) {
                std::wstring s = w.substr(0, i) + ch + w.substr(i);
                TWord c = LangModel.GetWord(s);
                if (c.Ptr && c.Len) {
                    result.push_back(c);
                }
                if (!lastLevel) {
                    AddVec(result, Edits2(TWord(s)));
                }
            }
        }
    }

    return result;
}